

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_float_convert.cpp
# Opt level: O3

void local_float_convert::get_random_digit_string<31ul,2ul>(string *str)

{
  result_type rVar1;
  result_type_conflict __n;
  ulong uVar2;
  ulong uVar3;
  
  if (get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_sgn == '\0') {
    get_random_digit_string<31ul,2ul>();
  }
  if (get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_len == '\0') {
    get_random_digit_string<31ul,2ul>();
  }
  if (get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_first == '\0') {
    get_random_digit_string<31ul,2ul>();
  }
  if (get_random_digit_string<31ul,2ul>(std::__cxx11::string&)::dist_following == '\0') {
    get_random_digit_string<31ul,2ul>();
  }
  engine_sgn();
  rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                    (&get_random_digit_string<31UL,_2UL>::dist_sgn,&engine_sgn::my_engine_sgn,
                     &get_random_digit_string<31UL,_2UL>::dist_sgn._M_param);
  engine_e10();
  __n = std::uniform_int_distribution<unsigned_long>::operator()
                  (&get_random_digit_string<31UL,_2UL>::dist_len,&engine_e10::my_engine_e10,
                   &get_random_digit_string<31UL,_2UL>::dist_len._M_param);
  if (rVar1 == 0) {
    uVar3 = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (str,__n,'\0');
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (str,__n + 1,'\0');
    if (str->_M_string_length == 0) {
      uVar3 = 0;
      uVar2 = 0;
      goto LAB_0012e8d5;
    }
    *(str->_M_dataplus)._M_p = '-';
    uVar3 = 1;
  }
  engine_man();
  rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                    (&get_random_digit_string<31UL,_2UL>::dist_first,&engine_man::my_engine_man,
                     &get_random_digit_string<31UL,_2UL>::dist_first._M_param);
  uVar2 = str->_M_string_length;
  if (uVar3 < uVar2) {
    (str->_M_dataplus)._M_p[uVar3] = (char)rVar1 + '0';
    uVar3 = uVar3 + 1;
    if (uVar3 < str->_M_string_length) {
      do {
        engine_man();
        rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                          (&get_random_digit_string<31UL,_2UL>::dist_following,
                           &engine_man::my_engine_man,
                           &get_random_digit_string<31UL,_2UL>::dist_following._M_param);
        uVar2 = str->_M_string_length;
        if (uVar2 <= uVar3) goto LAB_0012e8d5;
        (str->_M_dataplus)._M_p[uVar3] = (char)rVar1 + '0';
        uVar3 = uVar3 + 1;
      } while (uVar3 < str->_M_string_length);
    }
    return;
  }
LAB_0012e8d5:
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar3,uVar2);
}

Assistant:

auto get_random_digit_string(std::string& str) -> void // NOLINT(google-runtime-references)
  {
    static_assert(MinDigitsToGet >=  2U, "Error: The minimum number of digits to get must be  2 or more");

    static auto dist_sgn = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(0)),
                                               static_cast<unsigned>(UINT8_C(1)));

    static auto dist_len = unsigned_dist_maker(MinDigitsToGet, MaxDigitsToGet);

    static auto dist_first = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(1)),
                                                 static_cast<unsigned>(UINT8_C(9)));

    static auto dist_following = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(0)),
                                                     static_cast<unsigned>(UINT8_C(9)));

    const bool is_neg = (dist_sgn(engine_sgn()) != 0);

    const auto len = dist_len(engine_e10());

    auto pos = static_cast<std::string::size_type>(0U);

    if(is_neg)
    {
      str.resize(len + 1U);

      str.at(pos) = '-';

      ++pos;
    }
    else
    {
      str.resize(len);
    }

    str.at(pos) =
      static_cast<char>
      (
          dist_first(engine_man())
        + static_cast<std::uniform_int_distribution<unsigned>::result_type>(UINT32_C(0x30))
      );

    ++pos;

    while(pos < str.length())
    {
      str.at(pos) =
        static_cast<char>
        (
            dist_following(engine_man())
          + static_cast<std::uniform_int_distribution<unsigned>::result_type>(UINT32_C(0x30))
        );

      ++pos;
    }
  }